

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O0

void __thiscall
defyx::SuperscalarInstruction::create
          (SuperscalarInstruction *this,SuperscalarInstructionInfo *info,Blake2Generator *gen)

{
  byte bVar1;
  bool bVar2;
  SuperscalarInstructionType SVar3;
  uint32_t uVar4;
  Blake2Generator *this_00;
  SuperscalarInstructionInfo *in_RSI;
  SuperscalarInstruction *in_RDI;
  
  in_RDI->info_ = in_RSI;
  reset(in_RDI);
  SVar3 = SuperscalarInstructionInfo::getType(in_RSI);
  this_00 = (Blake2Generator *)(ulong)(uint)SVar3;
  switch(this_00) {
  case (Blake2Generator *)0x0:
    in_RDI->mod_ = 0;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = IADD_RS;
    in_RDI->groupParIsSource_ = true;
    break;
  case (Blake2Generator *)0x1:
    in_RDI->mod_ = 0;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = IXOR_R;
    in_RDI->groupParIsSource_ = true;
    break;
  case (Blake2Generator *)0x2:
    bVar1 = Blake2Generator::getByte(this_00);
    in_RDI->mod_ = (uint)bVar1;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = IADD_RS;
    in_RDI->groupParIsSource_ = true;
    break;
  case (Blake2Generator *)0x3:
    in_RDI->mod_ = 0;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = IMUL_R;
    in_RDI->groupParIsSource_ = true;
    break;
  case (Blake2Generator *)0x4:
    in_RDI->mod_ = 0;
    do {
      bVar1 = Blake2Generator::getByte(this_00);
      in_RDI->imm32_ = bVar1 & 0x3f;
    } while (in_RDI->imm32_ == 0);
    in_RDI->opGroup_ = IROR_C;
    in_RDI->opGroupPar_ = -1;
    break;
  case (Blake2Generator *)0x5:
  case (Blake2Generator *)0x7:
  case (Blake2Generator *)0x9:
    in_RDI->mod_ = 0;
    uVar4 = Blake2Generator::getUInt32(this_00);
    in_RDI->imm32_ = uVar4;
    in_RDI->opGroup_ = IADD_C7;
    in_RDI->opGroupPar_ = -1;
    break;
  case (Blake2Generator *)0x6:
  case (Blake2Generator *)0x8:
  case (Blake2Generator *)0xa:
    in_RDI->mod_ = 0;
    uVar4 = Blake2Generator::getUInt32(this_00);
    in_RDI->imm32_ = uVar4;
    in_RDI->opGroup_ = IXOR_C7;
    in_RDI->opGroupPar_ = -1;
    break;
  case (Blake2Generator *)0xb:
    in_RDI->canReuse_ = true;
    in_RDI->mod_ = 0;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = IMULH_R;
    uVar4 = Blake2Generator::getUInt32(this_00);
    in_RDI->opGroupPar_ = uVar4;
    break;
  case (Blake2Generator *)0xc:
    in_RDI->canReuse_ = true;
    in_RDI->mod_ = 0;
    in_RDI->imm32_ = 0;
    in_RDI->opGroup_ = ISMULH_R;
    uVar4 = Blake2Generator::getUInt32(this_00);
    in_RDI->opGroupPar_ = uVar4;
    break;
  case (Blake2Generator *)0xd:
    in_RDI->mod_ = 0;
    do {
      uVar4 = Blake2Generator::getUInt32(this_00);
      in_RDI->imm32_ = uVar4;
      bVar2 = isZeroOrPowerOf2((ulong)in_RDI->imm32_);
    } while (bVar2);
    in_RDI->opGroup_ = IMUL_RCP;
    in_RDI->opGroupPar_ = -1;
  }
  return;
}

Assistant:

void create(const SuperscalarInstructionInfo* info, Blake2Generator& gen) {
			info_ = info;
			reset();
			switch (info->getType())
			{
			case SuperscalarInstructionType::ISUB_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IADD_RS;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IXOR_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IXOR_R;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IADD_RS: {
				mod_ = gen.getByte();
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IADD_RS;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IMUL_R: {
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IMUL_R;
				groupParIsSource_ = true;
			} break;

			case SuperscalarInstructionType::IROR_C: {
				mod_ = 0;
				do {
					imm32_ = gen.getByte() & 63;
				} while (imm32_ == 0);
				opGroup_ = SuperscalarInstructionType::IROR_C;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IADD_C7:
			case SuperscalarInstructionType::IADD_C8:
			case SuperscalarInstructionType::IADD_C9: {
				mod_ = 0;
				imm32_ = gen.getUInt32();
				opGroup_ = SuperscalarInstructionType::IADD_C7;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IXOR_C7:
			case SuperscalarInstructionType::IXOR_C8:
			case SuperscalarInstructionType::IXOR_C9: {
				mod_ = 0;
				imm32_ = gen.getUInt32();
				opGroup_ = SuperscalarInstructionType::IXOR_C7;
				opGroupPar_ = -1;
			} break;

			case SuperscalarInstructionType::IMULH_R: {
				canReuse_ = true;
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::IMULH_R;
				opGroupPar_ = gen.getUInt32();
			} break;

			case SuperscalarInstructionType::ISMULH_R: {
				canReuse_ = true;
				mod_ = 0;
				imm32_ = 0;
				opGroup_ = SuperscalarInstructionType::ISMULH_R;
				opGroupPar_ = gen.getUInt32();
			} break;

			case SuperscalarInstructionType::IMUL_RCP: {
				mod_ = 0;
				do {
					imm32_ = gen.getUInt32();
				} while (isZeroOrPowerOf2(imm32_));
				opGroup_ = SuperscalarInstructionType::IMUL_RCP;
				opGroupPar_ = -1;
			} break;

			default:
				break;
			}
		}